

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  char cVar1;
  bool bVar2;
  ReaderFor<bool> RVar3;
  int32_t iVar4;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar5;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  int32_t local_25c;
  Reader methodName;
  Builder local_248;
  ReaderFor<DynamicStruct> local_218;
  Reader params;
  Fault f;
  Maybe<capnp::MessageSize> local_48;
  
  f.exception = (Exception *)method.proto._reader.segment;
  methodName = capnp::schema::Method::Reader::getName((Reader *)&f);
  f.exception = (Exception *)0x4f93d8;
  bVar2 = kj::StringPtr::operator==(&methodName.super_StringPtr,(StringPtr *)&f);
  if (bVar2) {
    **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams(&params,&context);
    name.content.size_ = 2;
    name.content.ptr = "i";
    DynamicStruct::Reader::get((Reader *)&f,&params,name);
    iVar4 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if ((iVar4 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
      local_248.schema.super_Schema.raw._0_4_ = 0x7b;
      name_00.content.size_ = 2;
      name_00.content.ptr = "i";
      DynamicStruct::Reader::get((Reader *)&f,&params,name_00);
      local_25c = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&f);
      kj::_::Debug::log<char_const(&)[54],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", 123, params.get(\"i\").as<int>()"
                 ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                 (int *)&local_248,&local_25c);
      DynamicValue::Reader::~Reader((Reader *)&f);
    }
    name_01.content.size_ = 2;
    name_01.content.ptr = "j";
    DynamicStruct::Reader::get((Reader *)&f,&params,name_01);
    RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
    if (!RVar3 && kj::_::Debug::minSeverity < 3) {
      kj::_::Debug::log<char_const(&)[44]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x191,ERROR,"\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\"",
                 (char (*) [44])"failed: expected params.get(\"j\").as<bool>()");
    }
    local_48.ptr.isSet = false;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getResults
              (&local_248,&context,&local_48);
    f.exception._0_4_ = 6;
    name_03.content.size_ = 2;
    name_03.content.ptr = "x";
    DynamicStruct::Builder::set(&local_248,name_03,(Reader *)&f);
    DynamicValue::Reader::~Reader((Reader *)&f);
  }
  else {
    f.exception = (Exception *)0x518f2f;
    bVar2 = kj::StringPtr::operator==(&methodName.super_StringPtr,(StringPtr *)&f);
    if (bVar2) {
      **(int **)(in_RSI + 0x18) = **(int **)(in_RSI + 0x18) + 1;
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams(&params,&context);
      name_02.content.size_ = 2;
      name_02.content.ptr = "s";
      DynamicStruct::Reader::get((Reader *)&f,&params,name_02);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_218,(Reader *)&f);
      reader.reader.segment = local_218.reader.segment;
      reader.schema.super_Schema.raw = local_218.schema.super_Schema.raw;
      reader.reader.capTable = local_218.reader.capTable;
      reader.reader.data = local_218.reader.data;
      reader.reader.pointers = local_218.reader.pointers;
      reader.reader.dataSize = local_218.reader.dataSize;
      reader.reader.pointerCount = local_218.reader.pointerCount;
      reader.reader._38_2_ = local_218.reader._38_2_;
      reader.reader.nestingLimit = local_218.reader.nestingLimit;
      reader.reader._44_4_ = local_218.reader._44_4_;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader((Reader *)&f);
      (*(context.hook)->_vptr_CallContextHook[1])();
      local_248.schema.super_Schema.raw = (Schema)&PTR_run_006575b8;
      local_248.builder.segment = (SegmentBuilder *)&context;
      kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&f,(Runnable *)&local_248);
      cVar1 = (char)f.exception;
      kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
      if ((cVar1 == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[88]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x199,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
                   ,(char (*) [88])
                    "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
                  );
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x19c,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
                 (char (*) [23])"Method not implemented",(Reader *)&methodName.super_StringPtr);
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar5.super_PromiseBase.node.ptr = extraout_RDX;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }